

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O1

void __thiscall
QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::clear
          (QMap<int,_QMap<int,_QSpanCollection::Span_*>_> *this)

{
  _Rb_tree_header *p_Var1;
  QMapData<std::map<int,_QMap<int,_QSpanCollection::Span_*>,_std::less<int>,_std::allocator<std::pair<const_int,_QMap<int,_QSpanCollection::Span_*>_>_>_>_>
  *pQVar2;
  
  pQVar2 = (this->d).d.ptr;
  if (pQVar2 != (QMapData<std::map<int,_QMap<int,_QSpanCollection::Span_*>,_std::less<int>,_std::allocator<std::pair<const_int,_QMap<int,_QSpanCollection::Span_*>_>_>_>_>
                 *)0x0) {
    if ((__atomic_base<int>)
        *(__int_type *)
         &(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value != (__atomic_base<int>)0x1) {
      QtPrivate::
      QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QMap<int,_QSpanCollection::Span_*>,_std::less<int>,_std::allocator<std::pair<const_int,_QMap<int,_QSpanCollection::Span_*>_>_>_>_>_>
      ::reset(&this->d,(QMapData<std::map<int,_QMap<int,_QSpanCollection::Span_*>,_std::less<int>,_std::allocator<std::pair<const_int,_QMap<int,_QSpanCollection::Span_*>_>_>_>_>
                        *)0x0);
      return;
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_QMap<int,_QSpanCollection::Span_*>_>,_std::_Select1st<std::pair<const_int,_QMap<int,_QSpanCollection::Span_*>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_QMap<int,_QSpanCollection::Span_*>_>_>_>
    ::_M_erase(&(pQVar2->m)._M_t,
               *(_Link_type *)((long)&(pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header + 8))
    ;
    p_Var1 = &(pQVar2->m)._M_t._M_impl.super__Rb_tree_header;
    *(_Base_ptr *)((long)&(pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header + 8) =
         (_Base_ptr)0x0;
    *(_Rb_tree_header **)((long)&(pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10) =
         p_Var1;
    *(_Rb_tree_header **)((long)&(pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x18) =
         p_Var1;
    (pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  }
  return;
}

Assistant:

constexpr P get() const noexcept { return ptr; }